

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

void __thiscall diy::mpi::environment::environment(environment *this,int argc,char **argv)

{
  undefined8 in_RDI;
  undefined1 local_18 [12];
  undefined1 local_c [12];
  
  MPI_Init_thread(local_c,local_18,1,in_RDI);
  return;
}

Assistant:

diy::mpi::environment::environment(int argc, char* argv[])
{
#if DIY_HAS_MPI
  MPI_Init_thread(&argc, &argv, MPI_THREAD_FUNNELED, &provided_threading);
#else
  (void) argc; (void) argv;
  provided_threading = MPI_THREAD_FUNNELED;
#endif
}